

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar1;
  uint *puVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  Variant *pVVar4;
  SPIRFunction *pSVar5;
  char cVar6;
  uint32_t uVar7;
  uint uVar8;
  SPIRType *pSVar9;
  SPIRVariable *pSVar10;
  MSLConstexprSampler *pMVar11;
  size_type sVar12;
  char (*pacVar13) [16];
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  _Hash_node_base *p_Var14;
  long lVar15;
  ulong uVar16;
  __hashtable *__h;
  Parameter *arg;
  bool bVar17;
  __node_gen_type __node_gen;
  string decl;
  char *sampler_address_space;
  undefined7 in_stack_ffffffffffffff10;
  string local_e8;
  SPIRFunction *local_c8;
  ulong local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Parameter *local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  this_00 = &(this->super_CompilerGLSL).local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&(this->super_CompilerGLSL).resource_names._M_h);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  bVar17 = (func->super_IVariant).self.id ==
           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  (this->super_CompilerGLSL).processing_entry_point = bVar17;
  if (!bVar17) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  local_c8 = func;
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(func->super_IVariant).field_0xc);
  if (((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->msl_options).force_native_arrays != true)) {
    func_type_decl_abi_cxx11_(&local_e8,this,pSVar9);
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&local_b8);
  }
  ::std::__cxx11::string::append((char *)&local_b8);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_e8,this,(ulong)(local_c8->super_IVariant).self.id,1);
  ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_b8);
  if (((pSVar9->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     ((this->msl_options).force_native_arrays == true)) {
    ::std::__cxx11::string::append((char *)&local_b8);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_e8,this,pSVar9,0);
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_b8);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_e8,this,pSVar9,0);
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
    pSVar5 = local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((pSVar5->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size != 0)
    {
      ::std::__cxx11::string::append((char *)&local_b8);
    }
  }
  if ((this->super_CompilerGLSL).processing_entry_point == true) {
    if ((this->msl_options).argument_buffers == true) {
      entry_point_args_argument_buffer_abi_cxx11_
                (&local_e8,this,
                 (local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
    }
    else {
      entry_point_args_classic_abi_cxx11_
                (&local_e8,this,
                 (local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    p_Var14 = (this->super_CompilerGLSL).resource_names._M_h._M_before_begin._M_nxt;
    local_e8._M_dataplus._M_p = (pointer)this_00;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      do {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,p_Var14 + 1,&local_e8);
        p_Var14 = p_Var14->_M_nxt;
      } while (p_Var14 != (_Hash_node_base *)0x0);
    }
    sVar1 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    if (sVar1 != 0) {
      puVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr;
      lVar15 = 0;
      do {
        pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)((long)puVar2 + lVar15));
        if ((pSVar10->initializer).id == 0) {
          uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          (pSVar10->initializer).id = uVar7;
        }
        uVar8 = (pSVar10->initializer).id;
        if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr[uVar8].type & ~TypeExpression) == TypeNone) {
          local_e8._M_dataplus._M_p._0_1_ = 1;
          in_R8 = &local_e8;
          Compiler::
          set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    ((Compiler *)this,uVar8,(char (*) [3])0x39e9c8,
                     (TypedID<(spirv_cross::Types)1> *)&(pSVar10->super_IVariant).field_0xc,
                     (bool *)in_R8);
        }
        lVar15 = lVar15 + 4;
      } while (sVar1 << 2 != lVar15);
    }
    sVar1 = (local_c8->local_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    if (sVar1 != 0) {
      pTVar3 = (local_c8->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      lVar15 = 0;
      do {
        pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)((long)&pTVar3->id + lVar15));
        if (pSVar10->storage == StorageClassTaskPayloadWorkgroupEXT) {
          CompilerGLSL::add_local_variable_name
                    (&this->super_CompilerGLSL,*(uint32_t *)((long)&pTVar3->id + lVar15));
          local_78._M_string_length = 0;
          local_78._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&pTVar3->id + lVar15);
          local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)&(pSVar10->super_IVariant).field_0xc;
          local_78.field_2._M_local_buf[0] = '\x01';
          argument_decl_abi_cxx11_(&local_98,this,(Parameter *)&local_78);
          join<char_const(&)[3],std::__cxx11::string,char_const(&)[13]>
                    (&local_e8,(spirv_cross *)0x3a2bb2,(char (*) [3])&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " [[payload]]",(char (*) [13])in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
        lVar15 = lVar15 + 4;
      } while (sVar1 << 2 != lVar15);
    }
  }
  sVar1 = (local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar1 != 0) {
    arg = (local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    local_50 = arg + sVar1;
    local_40 = &this->plane_name_suffix;
    local_48 = &(this->buffers_requiring_array_length)._M_h;
    do {
      uVar16 = (ulong)(arg->id).id;
      if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar16].type == TypeVariable))
      {
        pSVar10 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar16);
      }
      else {
        pSVar10 = (SPIRVariable *)0x0;
      }
      if (pSVar10 != (SPIRVariable *)0x0) {
        if ((arg->alias_global_variable == true) && (uVar8 = (pSVar10->basevariable).id, uVar8 != 0)
           ) {
          uVar16 = (ulong)uVar8;
        }
        pSVar10->parameter = arg;
      }
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(uint32_t)uVar16);
      argument_decl_abi_cxx11_(&local_e8,this,arg);
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_c0 = uVar16;
      cVar6 = Compiler::has_extended_decoration
                        ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
      pSVar9 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
      if (pSVar9->basetype == SampledImage && cVar6 == '\0') {
        pMVar11 = find_constexpr_sampler(this,(uint32_t)local_c0);
        uVar7 = 1;
        if ((pMVar11 != (MSLConstexprSampler *)0x0) && (pMVar11->ycbcr_conversion_enable == true)) {
          uVar7 = pMVar11->planes;
        }
        local_78._M_dataplus._M_p._0_4_ = 1;
        if (1 < uVar7) {
          do {
            argument_decl_abi_cxx11_(&local_98,this,arg);
            in_R8 = &local_78;
            join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                      (&local_e8,(spirv_cross *)0x3a2bb2,(char (*) [3])&local_98,local_40,in_R8,
                       (uint *)in_R9);
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            uVar8 = (uint)local_78._M_dataplus._M_p + 1;
            local_78._M_dataplus._M_p._0_4_ = uVar8;
          } while (uVar8 < uVar7);
        }
        if ((pSVar9->image).dim != Buffer) {
          if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) {
LAB_0024ab12:
            sampler_type_abi_cxx11_(&local_98,this,pSVar9,(arg->id).id,false);
            in_R8 = &local_78;
            to_sampler_expression_abi_cxx11_(in_R8,this,(uint32_t)local_c0);
            join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                      (&local_e8,(spirv_cross *)0x3a2bb2,(char (*) [3])&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641
                       ,(char (*) [2])in_R8,in_R9);
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
          }
          else {
            if (pSVar10 == (SPIRVariable *)0x0) {
              bVar17 = Compiler::is_runtime_size_array(pSVar9);
            }
            else {
              bVar17 = is_var_runtime_size_array(this,pSVar10);
            }
            if (bVar17 != false) goto LAB_0024ab12;
            uVar7 = (uint32_t)local_c0;
            local_38 = descriptor_address_space
                                 (this,uVar7,StorageClassUniformConstant,"thread const");
            sampler_type_abi_cxx11_(&local_98,this,pSVar9,uVar7,false);
            to_sampler_expression_abi_cxx11_(&local_78,this,uVar7);
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a0929;
            in_R8 = &local_98;
            join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      (&local_e8,(spirv_cross *)0x3a2bb2,(char (*) [3])&local_38,(char **)0x378641,
                       (char (*) [2])&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a0929
                       ,(char (*) [3])&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(cVar6,in_stack_ffffffffffffff10));
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      if (((this->msl_options).swizzle_texture_samples == true) &&
         (this->has_sampled_images == true)) {
        bVar17 = Compiler::is_sampled_image_type((Compiler *)this,pSVar9);
        if (cVar6 == '\0' && bVar17) {
          sVar1 = (pSVar9->array).super_VectorView<unsigned_int>.buffer_size;
          to_swizzle_expression_abi_cxx11_(&local_98,this,(uint32_t)local_c0);
          pacVar13 = (char (*) [16])0x3a5f61;
          if (sVar1 == 0) {
            pacVar13 = (char (*) [16])0x3a0929;
          }
          join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                    (&local_e8,(spirv_cross *)", constant uint",pacVar13,(char (*) [3])&local_98,
                     in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      local_e8._M_dataplus._M_p._0_4_ = (int)local_c0;
      sVar12 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_48,(key_type *)&local_e8);
      if (sVar12 != 0) {
        sVar1 = (pSVar9->array).super_VectorView<unsigned_int>.buffer_size;
        to_buffer_size_expression_abi_cxx11_(&local_98,this,(uint32_t)local_c0);
        pacVar13 = (char (*) [16])0x3a5f61;
        if (sVar1 == 0) {
          pacVar13 = (char (*) [16])0x3a0929;
        }
        join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                  (&local_e8,(spirv_cross *)", constant uint",pacVar13,(char (*) [3])&local_98,in_R8
                  );
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      if (arg != (local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
                 ((local_c8->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                  buffer_size - 1)) {
        ::std::__cxx11::string::append((char *)&local_b8);
      }
      arg = arg + 1;
    } while (arg != local_50);
  }
  ::std::__cxx11::string::append((char *)&local_b8);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type, 0);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}

		// add `taskPayloadSharedEXT` variable to entry-point arguments
		for (auto &v : func.local_variables)
		{
			auto &var = get<SPIRVariable>(v);
			if (var.storage != StorageClassTaskPayloadWorkgroupEXT)
				continue;

			add_local_variable_name(v);
			SPIRFunction::Parameter arg = {};
			arg.id = v;
			arg.type = var.basetype;
			arg.alias_global_variable = true;
			decl += join(", ", argument_decl(arg), " [[payload]]");
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty() || (var ? is_var_runtime_size_array(*var) : is_runtime_size_array(arg_type)))
				{
					decl += join(", ", sampler_type(arg_type, arg.id, false), " ", to_sampler_expression(name_id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, name_id, false), "& ",
					             to_sampler_expression(name_id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(name_id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}